

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O2

ON_wString __thiscall
ON_ModelComponent::RemoveAllReferencePrefixDelimiters(ON_ModelComponent *this,wchar_t *name)

{
  bool bVar1;
  wchar_t *token1;
  ON_wString *src;
  ON_wString local;
  ON_wString OStack_18;
  
  src = &OStack_18;
  if ((name == (wchar_t *)0x0) || (*name == L'\0')) {
    ON_wString::ON_wString((ON_wString *)this,&ON_wString::EmptyString);
  }
  else {
    ON_wString::ON_wString(&OStack_18,name);
    token1 = ON_wString::operator_cast_to_wchar_t_(&ReferencePrefixDelimiter);
    ON_wString::Replace(&OStack_18,token1,(wchar_t *)0x0);
    bVar1 = ON_wString::IsNotEmpty(&OStack_18);
    if (!bVar1) {
      src = &ON_wString::EmptyString;
    }
    ON_wString::ON_wString((ON_wString *)this,src);
    ON_wString::~ON_wString(&OStack_18);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_ModelComponent::RemoveAllReferencePrefixDelimiters(
  const wchar_t* name
)
{
  if ( nullptr == name || 0 == name[0] )
    return ON_wString::EmptyString;

  ON_wString local(name);
  local.Replace(ON_ModelComponent::ReferencePrefixDelimiter, nullptr);

  return local.IsNotEmpty() ? local : ON_wString::EmptyString;
}